

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

int zt_unit_main(zt_unit *unit,int argc,char **argv)

{
  int iVar1;
  zt_unit *in_RDX;
  int in_ESI;
  long in_RDI;
  char *msg;
  int result;
  int i;
  int local_28;
  int local_24;
  
  local_28 = 0;
  local_24 = 1;
  while( true ) {
    if (in_ESI <= local_24) {
      if (in_ESI < 2) {
        local_28 = zt_unit_run(in_RDX);
        if (local_28 < 0) {
          return local_28;
        }
      }
      else {
        for (local_24 = 1; local_24 < in_ESI; local_24 = local_24 + 1) {
          iVar1 = zt_unit_run_by_name(_result,msg);
          if (iVar1 < 0) {
            printf("Suite or Test \"%s\" not found\n",(&(in_RDX->suites).prev)[local_24]);
            local_28 = -1;
          }
        }
      }
      if ((local_28 == 0) && (*(int *)(in_RDI + 0x1c) != 0)) {
        local_28 = -1;
      }
      return local_28;
    }
    iVar1 = strcmp((char *)(&(in_RDX->suites).prev)[local_24],"-h");
    if ((iVar1 == 0) ||
       (iVar1 = strcmp((char *)(&(in_RDX->suites).prev)[local_24],"--help"), iVar1 == 0)) break;
    iVar1 = strcmp((char *)(&(in_RDX->suites).prev)[local_24],"-l");
    if ((iVar1 == 0) ||
       (iVar1 = strcmp((char *)(&(in_RDX->suites).prev)[local_24],"--list"), iVar1 == 0)) {
      zt_unit_list(in_RDX);
      return 0;
    }
    local_24 = local_24 + 1;
  }
  printf("%s %s",(in_RDX->suites).prev,
         "[options] <suite | suite.test> ...\n\nOptions:\n     -h, --help               This help text\n     -l, --list               list suites and test (default disabled)\n"
        );
  return 0;
}

Assistant:

int
zt_unit_main(struct zt_unit    * unit,
             int argc,
             char    * argv[])
{
    int                i;
    int                result = 0;

    char * msg = "[options] <suite | suite.test> ..."NL
                ""NL
                "Options:"NL
                "     -h, --help               This help text"NL
                "     -l, --list               list suites and test (default disabled)"NL;

    for(i=1; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0 ||
           strcmp(argv[i], "--help") == 0) {
            printf("%s %s", argv[0], msg);
            return 0;
        } else if(strcmp(argv[i], "-l") == 0 ||
                  strcmp(argv[i], "--list") == 0) {
            zt_unit_list(unit);
            return 0;
        }
    }

    if (argc > 1) {
        for (i = 1; i < argc; i++) {
            if (zt_unit_run_by_name(unit, argv[i]) < 0) {
                printf("Suite or Test \"%s\" not found\n", argv[i]);
                result = -1;
            }
        }
    } else {
        if ((result = zt_unit_run(unit)) < 0) {
            return result;
        }
    }

    if (result == 0) {
        if (unit->failures > 0) {
            result = -1;
        }
    }
    return result;
}